

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask_data(tst_RoleMaskProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  __atomic_base<int> _Var2;
  QModelIndex *data;
  QTestData *pQVar3;
  long lVar4;
  QList<QModelIndex> *pQVar5;
  QModelIndex *pQVar6;
  byte bVar7;
  QAbstractItemModel *baseModel;
  QArrayData *d;
  QAbstractItemModel *local_f0;
  QList<QModelIndex> local_e8;
  QList<QModelIndex> local_d0;
  undefined8 uStack_b8;
  quintptr local_b0;
  QAbstractItemModel *pQStack_a8;
  undefined1 local_a0 [24];
  QArrayData *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [24];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar7 = 0;
  local_d0.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var2._M_i,"baseModel");
  local_d0.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var2._M_i,"magicNumerIndexes");
  QTest::addColumnInternal(1,"userRoleEditable");
  local_f0 = createListModel(&this->super_QObject);
  pQVar3 = (QTestData *)QTest::newRow("List");
  pQVar3 = operator<<(pQVar3,&local_f0);
  local_70 = 0xffffffffffffffff;
  local_68 = 0;
  uStack_60 = 0;
  (**(code **)(*(long *)local_f0 + 0x60))(&local_e8,local_f0,0,0);
  local_d0.d.ptr = (QModelIndex *)QArrayData::allocate(&local_88,0x18,8,1,KeepSize);
  local_d0.d.d = (Data *)local_88;
  (local_d0.d.ptr)->m = (QAbstractItemModel *)local_e8.d.size;
  *(Data **)local_d0.d.ptr = local_e8.d.d;
  (local_d0.d.ptr)->i = (quintptr)local_e8.d.ptr;
  local_d0.d.size = 1;
  pQVar3 = operator<<(pQVar3,&local_d0);
  local_88 = (QArrayData *)((ulong)local_88 & 0xffffffffffffff00);
  QTestData::append((int)pQVar3,(void *)0x1);
  if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,0x18,8);
    }
  }
  local_f0 = createTableModel(&this->super_QObject);
  if (local_f0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Table");
    pQVar3 = operator<<(pQVar3,&local_f0);
    local_70 = 0xffffffffffffffff;
    local_68 = 0;
    uStack_60 = 0;
    (**(code **)(*(long *)local_f0 + 0x60))(&local_d0,local_f0,1,0);
    local_88 = (QArrayData *)0xffffffffffffffff;
    local_80 = 0;
    uStack_78 = 0;
    (**(code **)(*(long *)local_f0 + 0x60))(&uStack_b8,local_f0,0,1);
    local_e8.d.ptr = (QModelIndex *)QArrayData::allocate((QArrayData **)&local_e8,0x18,8,2,KeepSize)
    ;
    *(Data **)local_e8.d.ptr = local_d0.d.d;
    (local_e8.d.ptr)->i = (quintptr)local_d0.d.ptr;
    (local_e8.d.ptr)->m = (QAbstractItemModel *)local_d0.d.size;
    local_e8.d.ptr[1].r = (undefined4)uStack_b8;
    local_e8.d.ptr[1].c = uStack_b8._4_4_;
    local_e8.d.ptr[1].i = local_b0;
    local_e8.d.ptr[1].m = pQStack_a8;
    local_e8.d.size = 2;
    pQVar3 = operator<<(pQVar3,&local_e8);
    local_58[0] = 1;
    QTestData::append((int)pQVar3,(void *)0x1);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,0x18,8);
      }
    }
  }
  local_f0 = createTreeModel(&this->super_QObject);
  if (local_f0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Tree");
    pQVar3 = operator<<(pQVar3,&local_f0);
    local_70 = 0xffffffffffffffff;
    local_68 = 0;
    uStack_60 = 0;
    (**(code **)(*(long *)local_f0 + 0x60))(&local_d0,local_f0,1,0);
    local_88 = (QArrayData *)0xffffffffffffffff;
    local_80 = 0;
    uStack_78 = 0;
    (**(code **)(*(long *)local_f0 + 0x60))(&uStack_b8,local_f0,0,1);
    pQVar1 = local_f0;
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
    (**(code **)(*(long *)local_f0 + 0x60))(local_58,local_f0,0,0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_a0,pQVar1,0,1,local_58);
    local_e8.d.ptr = (QModelIndex *)QArrayData::allocate((QArrayData **)&local_e8,0x18,8,3,KeepSize)
    ;
    pQVar5 = &local_d0;
    pQVar6 = local_e8.d.ptr;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(Data **)pQVar6 = (pQVar5->d).d;
      pQVar5 = (QList<QModelIndex> *)((long)pQVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pQVar6 = (QModelIndex *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    local_e8.d.size = 3;
    pQVar3 = operator<<(pQVar3,&local_e8);
    QTestData::append((int)pQVar3,(void *)0x1);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,0x18,8);
      }
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndexList>("magicNumerIndexes");
    QTest::addColumn<bool>("userRoleEditable");
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List") << baseModel << QModelIndexList({baseModel->index(0, 0)}) << false;
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table") << baseModel << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1)}) << true;
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree") << baseModel
                              << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1), baseModel->index(0, 1, baseModel->index(0, 0))})
                              << true;
}